

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::NumberStringBuilder::toDebugString
          (UnicodeString *__return_storage_ptr__,NumberStringBuilder *this)

{
  Field FVar1;
  ConstChar16Ptr local_90;
  char16_t local_86;
  int local_84;
  char16_t c;
  int i;
  UnicodeString local_78;
  ConstChar16Ptr local_28;
  undefined1 local_19;
  NumberStringBuilder *local_18;
  NumberStringBuilder *this_local;
  UnicodeString *sb;
  
  local_19 = 0;
  local_18 = this;
  this_local = (NumberStringBuilder *)__return_storage_ptr__;
  UnicodeString::UnicodeString(__return_storage_ptr__);
  ConstChar16Ptr::ConstChar16Ptr(&local_28,L"<NumberStringBuilder [");
  UnicodeString::append(__return_storage_ptr__,&local_28,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_28);
  toUnicodeString(&local_78,this);
  UnicodeString::append(__return_storage_ptr__,&local_78);
  UnicodeString::~UnicodeString(&local_78);
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xffffffffffffff80,L"] [");
  UnicodeString::append(__return_storage_ptr__,(ConstChar16Ptr *)&stack0xffffffffffffff80,-1);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xffffffffffffff80);
  for (local_84 = 0; local_84 < this->fLength; local_84 = local_84 + 1) {
    FVar1 = fieldAt(this,local_84);
    if (FVar1 == UNUM_FIELD_COUNT) {
      UnicodeString::append(__return_storage_ptr__,L'n');
    }
    else {
      FVar1 = fieldAt(this,local_84);
      switch(FVar1) {
      case UNUM_INTEGER_FIELD:
        local_86 = L'i';
        break;
      case UNUM_FRACTION_FIELD:
        local_86 = L'f';
        break;
      case UNUM_DECIMAL_SEPARATOR_FIELD:
        local_86 = L'.';
        break;
      case UNUM_EXPONENT_SYMBOL_FIELD:
        local_86 = L'E';
        break;
      case UNUM_EXPONENT_SIGN_FIELD:
        local_86 = L'+';
        break;
      case UNUM_EXPONENT_FIELD:
        local_86 = L'e';
        break;
      case UNUM_GROUPING_SEPARATOR_FIELD:
        local_86 = L',';
        break;
      case UNUM_CURRENCY_FIELD:
        local_86 = L'$';
        break;
      case UNUM_PERCENT_FIELD:
        local_86 = L'%';
        break;
      case UNUM_PERMILL_FIELD:
        local_86 = L'‰';
        break;
      case UNUM_SIGN_FIELD:
        local_86 = L'-';
        break;
      default:
        local_86 = L'?';
      }
      UnicodeString::append(__return_storage_ptr__,local_86);
    }
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_90,L"]>");
  UnicodeString::append(__return_storage_ptr__,&local_90,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_90);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString NumberStringBuilder::toDebugString() const {
    UnicodeString sb;
    sb.append(u"<NumberStringBuilder [", -1);
    sb.append(toUnicodeString());
    sb.append(u"] [", -1);
    for (int i = 0; i < fLength; i++) {
        if (fieldAt(i) == UNUM_FIELD_COUNT) {
            sb.append(u'n');
        } else {
            char16_t c;
            switch (fieldAt(i)) {
                case UNUM_SIGN_FIELD:
                    c = u'-';
                    break;
                case UNUM_INTEGER_FIELD:
                    c = u'i';
                    break;
                case UNUM_FRACTION_FIELD:
                    c = u'f';
                    break;
                case UNUM_EXPONENT_FIELD:
                    c = u'e';
                    break;
                case UNUM_EXPONENT_SIGN_FIELD:
                    c = u'+';
                    break;
                case UNUM_EXPONENT_SYMBOL_FIELD:
                    c = u'E';
                    break;
                case UNUM_DECIMAL_SEPARATOR_FIELD:
                    c = u'.';
                    break;
                case UNUM_GROUPING_SEPARATOR_FIELD:
                    c = u',';
                    break;
                case UNUM_PERCENT_FIELD:
                    c = u'%';
                    break;
                case UNUM_PERMILL_FIELD:
                    c = u'‰';
                    break;
                case UNUM_CURRENCY_FIELD:
                    c = u'$';
                    break;
                default:
                    c = u'?';
                    break;
            }
            sb.append(c);
        }
    }
    sb.append(u"]>", -1);
    return sb;
}